

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoints.cpp
# Opt level: O1

void __thiscall
ary::KeypointPlaneLocalizer::KeypointPlaneLocalizer
          (KeypointPlaneLocalizer *this,SharedCameraModel *camera,KeypointType type)

{
  BFMatcher *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  Localizer::Localizer(&this->super_Localizer,camera);
  (this->super_Localizer).super_CameraUser._vptr_CameraUser =
       (_func_int **)&PTR__KeypointPlaneLocalizer_001267b8;
  cv::Mat::Mat(&this->mask);
  this->type = type;
  (this->models).
  super__Vector_base<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->models).
  super__Vector_base<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->models).
  super__Vector_base<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->detector).super_shared_ptr<cv::Feature2D>.
  super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->detector).super_shared_ptr<cv::Feature2D>.
  super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->matcher).super_shared_ptr<cv::DescriptorMatcher>.
  super___shared_ptr<cv::DescriptorMatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->matcher).super_shared_ptr<cv::DescriptorMatcher>.
  super___shared_ptr<cv::DescriptorMatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (type == AKAZE) {
    local_38 = (BFMatcher *)operator_new(0x40);
    cv::BFMatcher::BFMatcher(local_38,6,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cv::BFMatcher*>
              (&local_30,local_38);
  }
  else {
    if (type != ORB) {
      return;
    }
    local_38 = (BFMatcher *)operator_new(0x40);
    cv::BFMatcher::BFMatcher(local_38,6,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cv::BFMatcher*>
              (&local_30,local_38);
  }
  (this->matcher).super_shared_ptr<cv::DescriptorMatcher>.
  super___shared_ptr<cv::DescriptorMatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->matcher).super_shared_ptr<cv::DescriptorMatcher>.
              super___shared_ptr<cv::DescriptorMatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_30);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

KeypointPlaneLocalizer::KeypointPlaneLocalizer(const SharedCameraModel& camera, KeypointType type) : type(type), Localizer(camera) {

	switch (type) {
	case ORB:
#if CV_MAJOR_VERSION == 2
		detector = Ptr<Feature2D>((Feature2D*) new cv::ORB());
#elif CV_MAJOR_VERSION == 3
		detector = ORB::create().dynamicCast<Feature2D>();
#endif
		matcher = Ptr<DescriptorMatcher>(new BFMatcher(NORM_HAMMING, true));
		break;
	case AKAZE:
#if CV_MAJOR_VERSION == 2
		CV_Error(0, "AKAZE not supported in OpenCV 2.x.");
#elif CV_MAJOR_VERSION == 3
		detector = AKAZE::create().dynamicCast<Feature2D>();
#endif
		matcher = Ptr<DescriptorMatcher>(new BFMatcher(NORM_HAMMING, true));
		break;
	}

}